

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *pTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  string test_name;
  allocator local_a1;
  Int32 local_a0;
  Int32 local_9c;
  ulong local_98;
  ReactionToSharding local_90;
  int local_8c;
  pointer local_88;
  pointer local_80;
  TestSuite *local_78;
  string local_70;
  string local_50;
  
  local_9c = -1;
  local_a0 = -1;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_a0 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_9c = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  local_80 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_88 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_80 == local_88) {
    iVar6 = 0;
  }
  else {
    local_98 = 0;
    iVar6 = 0;
    local_90 = shard_tests;
    do {
      pTVar1 = *local_80;
      std::__cxx11::string::string
                ((string *)&local_50,(pTVar1->name_)._M_dataplus._M_p,(allocator *)&local_70);
      pTVar1->should_run_ = false;
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar5) {
        uVar7 = 0;
        local_78 = pTVar1;
        do {
          pTVar2 = ppTVar5[uVar7];
          std::__cxx11::string::string
                    ((string *)&local_70,(pTVar2->name_)._M_dataplus._M_p,&local_a1);
          local_8c = iVar6;
          bVar3 = UnitTestOptions::MatchesFilter(&local_50,"DISABLED_*:*/DISABLED_*");
          bVar4 = true;
          if (!bVar3) {
            bVar4 = UnitTestOptions::MatchesFilter(&local_70,"DISABLED_*:*/DISABLED_*");
          }
          pTVar2->is_disabled_ = bVar4;
          bVar3 = UnitTestOptions::FilterMatchesTest(&local_50,&local_70);
          pTVar1 = local_78;
          pTVar2->matches_filter_ = bVar3;
          if (shard_tests == IGNORE_SHARDING_PROTOCOL) {
            bVar9 = false;
          }
          else {
            bVar9 = (int)((long)((ulong)(uint)((int)local_98 >> 0x1f) << 0x20 |
                                local_98 & 0xffffffff) % (long)local_a0) != local_9c;
          }
          bVar8 = bVar3 & (bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar2->is_in_another_shard_ = bVar9;
          bVar3 = (bool)((bVar9 ^ 1U) & bVar8);
          pTVar2->should_run_ = bVar3;
          local_78->should_run_ = (bool)(local_78->should_run_ | bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          local_98 = (ulong)((int)local_98 + (uint)bVar8);
          iVar6 = local_8c + (uint)bVar3;
          uVar7 = uVar7 + 1;
          ppTVar5 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          shard_tests = local_90;
        } while (uVar7 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                                3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_80 = local_80 + 1;
    } while (local_80 != local_88);
  }
  return iVar6;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}